

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestXmmXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86XmmReg_x86XmmReg *fun)

{
  int iVar1;
  uint local_38;
  uint local_34;
  uint xmm2;
  uint xmm1;
  uchar *start;
  _func_int_uchar_ptr_x86XmmReg_x86XmmReg *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      EMIT_OP_REG_REG(ctx,op,testXmmRegs[local_34],testXmmRegs[local_38]);
      iVar1 = (*fun)(puStack_18,testXmmRegs[local_34],testXmmRegs[local_38]);
      puStack_18 = puStack_18 + iVar1;
    }
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestXmmXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86XmmReg src))
{
	unsigned char *start = stream;

	for(unsigned xmm1 = 0; xmm1 < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm1++)
	{
		for(unsigned xmm2 = 0; xmm2 < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm2++)
		{
			EMIT_OP_REG_REG(ctx, op, testXmmRegs[xmm1], testXmmRegs[xmm2]);
			stream += fun(stream, testXmmRegs[xmm1], testXmmRegs[xmm2]);
		}
	}

	return int(stream - start);
}